

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

CBlockIndex * __thiscall CChain::FindFork(CChain *this,CBlockIndex *pindex)

{
  long lVar1;
  pointer ppCVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindex == (CBlockIndex *)0x0) {
    pindex = (CBlockIndex *)0x0;
  }
  else {
    iVar3 = (int)((ulong)((long)(this->vChain).
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vChain).
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar3 <= pindex->nHeight) {
      pindex = CBlockIndex::GetAncestor(pindex,iVar3 + -1);
    }
    if (pindex != (CBlockIndex *)0x0) {
      ppCVar2 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        iVar3 = pindex->nHeight;
        if ((long)iVar3 < 0) {
          pCVar4 = (CBlockIndex *)0x0;
        }
        else {
          pCVar4 = (CBlockIndex *)0x0;
          if (iVar3 < (int)((ulong)((long)(this->vChain).
                                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2
                                   ) >> 3)) {
            pCVar4 = ppCVar2[iVar3];
          }
        }
      } while ((pCVar4 != pindex) && (pindex = pindex->pprev, pindex != (CBlockIndex *)0x0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pindex;
}

Assistant:

const CBlockIndex *CChain::FindFork(const CBlockIndex *pindex) const {
    if (pindex == nullptr) {
        return nullptr;
    }
    if (pindex->nHeight > Height())
        pindex = pindex->GetAncestor(Height());
    while (pindex && !Contains(pindex))
        pindex = pindex->pprev;
    return pindex;
}